

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_qmpsnr_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::EndToEndQMPSNRTest::PreEncodeFrameHook(EndToEndQMPSNRTest *this)

{
  Encoder *in_RDX;
  VideoSource *in_RSI;
  
  anon_unknown.dwarf_213a82d::EndToEndQMPSNRTest::PreEncodeFrameHook
            ((EndToEndQMPSNRTest *)(this + -0x18),in_RSI,in_RDX);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      encoder->Control(AV1E_SET_TILE_COLUMNS, 4);
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AOME_SET_TUNING, AOM_TUNE_SSIM);
      encoder->Control(AOME_SET_CQ_LEVEL, kCqLevel);
      encoder->SetOption("dist-metric", "qm-psnr");
    }
  }